

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O0

int gzip_bidder_init(archive_read_filter *self)

{
  void *__ptr;
  void *__ptr_00;
  long in_RDI;
  void *out_block;
  private_data_conflict *state;
  int local_4;
  
  *(undefined4 *)(in_RDI + 0x60) = 1;
  *(char **)(in_RDI + 0x58) = "gzip";
  __ptr = calloc(0xa0,1);
  __ptr_00 = malloc(0x10000);
  if ((__ptr == (void *)0x0) || (__ptr_00 == (void *)0x0)) {
    free(__ptr_00);
    free(__ptr);
    archive_set_error(*(archive **)(in_RDI + 0x18),0xc,"Can\'t allocate data for gzip decompression"
                     );
    local_4 = -0x1e;
  }
  else {
    *(void **)(in_RDI + 0x50) = __ptr;
    *(undefined8 *)((long)__ptr + 0x80) = 0x10000;
    *(void **)((long)__ptr + 0x78) = __ptr_00;
    *(code **)(in_RDI + 0x28) = gzip_filter_read;
    *(undefined8 *)(in_RDI + 0x30) = 0;
    *(code **)(in_RDI + 0x40) = gzip_filter_close;
    *(undefined1 *)((long)__ptr + 0x70) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
gzip_bidder_init(struct archive_read_filter *self)
{
	struct private_data *state;
	static const size_t out_block_size = 64 * 1024;
	void *out_block;

	self->code = ARCHIVE_FILTER_GZIP;
	self->name = "gzip";

	state = (struct private_data *)calloc(sizeof(*state), 1);
	out_block = (unsigned char *)malloc(out_block_size);
	if (state == NULL || out_block == NULL) {
		free(out_block);
		free(state);
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for gzip decompression");
		return (ARCHIVE_FATAL);
	}

	self->data = state;
	state->out_block_size = out_block_size;
	state->out_block = out_block;
	self->read = gzip_filter_read;
	self->skip = NULL; /* not supported */
	self->close = gzip_filter_close;

	state->in_stream = 0; /* We're not actually within a stream yet. */

	return (ARCHIVE_OK);
}